

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_31::PromiseOutputStream::write
          (PromiseOutputStream *this,int __fd,void *__buf,size_t __n)

{
  _func_int *p_Var1;
  PromiseNode *pPVar2;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  Own<kj::_::PromiseNode> OStack_68;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_48;
  Own<kj::_::PromiseNode> local_38;
  
  p_Var1 = ((_func_int **)CONCAT44(in_register_00000034,__fd))[4];
  if (p_Var1 == (_func_int *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&OStack_68);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&OStack_68,
               _::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3541:39),_kj::_::PropagateException>
               ::anon_class_24_2_4df0a340_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042b230;
    this_00[1].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)CONCAT44(in_register_00000034,__fd);
    this_00[1].dependency.disposer = (Disposer *)__buf;
    this_00[1].dependency.ptr = (PromiseNode *)__n;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::PromiseOutputStream::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)this_00;
    _::maybeChain<void>(&local_48,(Promise<void> *)&intermediate);
    pPVar2 = local_48.ptr;
    local_38.disposer = local_48.disposer;
    local_48.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_48);
    (this->super_AsyncOutputStream)._vptr_AsyncOutputStream = (_func_int **)local_48.disposer;
    (this->promise).hub.disposer = (Disposer *)pPVar2;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_38);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    Own<kj::_::PromiseNode>::dispose(&OStack_68);
  }
  else {
    (**(code **)(*(long *)p_Var1 + 8))(this,p_Var1,__buf,__n);
  }
  return (ssize_t)this;
}

Assistant:

KJ_IF_MAYBE(s, stream) {
      return s->get()->write(pieces);
    }